

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress3.c
# Opt level: O3

Gia_Man_t * Abc_NtkAigToGiaTwo(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int fByName)

{
  Abc_Obj_t *pObj;
  Nm_Man_t *pNVar1;
  void *pvVar2;
  Vec_Ptr_t *pVVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  undefined1 auVar6 [16];
  int iVar7;
  uint uVar8;
  Vec_Int_t *vMap;
  int *piVar9;
  Vec_Ptr_t *pVVar10;
  char *pcVar11;
  Gia_Man_t *p;
  size_t sVar12;
  char *pcVar13;
  Gia_Obj_t *pGVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  Vec_Int_t *local_48;
  
  if ((pNtk1->ntkFunc != ABC_FUNC_AIG) || (pNtk1->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsAigLogic(pNtk1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDress3.c"
                  ,0x7f,"Gia_Man_t *Abc_NtkAigToGiaTwo(Abc_Ntk_t *, Abc_Ntk_t *, int)");
  }
  if ((pNtk2->ntkFunc != ABC_FUNC_AIG) || (pNtk2->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsAigLogic(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDress3.c"
                  ,0x80,"Gia_Man_t *Abc_NtkAigToGiaTwo(Abc_Ntk_t *, Abc_Ntk_t *, int)");
  }
  pVVar10 = pNtk1->vCis;
  uVar19 = pVVar10->nSize;
  vMap = (Vec_Int_t *)malloc(0x10);
  uVar8 = 0x10;
  if (0xe < uVar19 - 1) {
    uVar8 = uVar19;
  }
  vMap->nCap = uVar8;
  if (fByName == 0) {
    if (uVar8 == 0) {
      piVar9 = (int *)0x0;
    }
    else {
      piVar9 = (int *)malloc((long)(int)uVar8 << 2);
    }
    vMap->pArray = piVar9;
    vMap->nSize = uVar19;
    auVar6 = _DAT_00912220;
    if (0 < (int)uVar19) {
      lVar18 = (ulong)uVar19 - 1;
      auVar22._8_4_ = (int)lVar18;
      auVar22._0_8_ = lVar18;
      auVar22._12_4_ = (int)((ulong)lVar18 >> 0x20);
      uVar16 = 0;
      auVar22 = auVar22 ^ _DAT_00912220;
      auVar25 = _DAT_00912210;
      do {
        auVar26 = auVar25 ^ auVar6;
        if ((bool)(~(auVar26._4_4_ == auVar22._4_4_ && auVar22._0_4_ < auVar26._0_4_ ||
                    auVar22._4_4_ < auVar26._4_4_) & 1)) {
          piVar9[uVar16] = (int)uVar16;
        }
        if ((auVar26._12_4_ != auVar22._12_4_ || auVar26._8_4_ <= auVar22._8_4_) &&
            auVar26._12_4_ <= auVar22._12_4_) {
          piVar9[uVar16 + 1] = (int)uVar16 + 1;
        }
        uVar16 = uVar16 + 2;
        lVar18 = auVar25._8_8_;
        auVar25._0_8_ = auVar25._0_8_ + 2;
        auVar25._8_8_ = lVar18 + 2;
      } while ((uVar19 + 1 & 0xfffffffe) != uVar16);
    }
    pVVar3 = pNtk2->vCis;
    uVar8 = pVVar3->nSize;
    local_48 = (Vec_Int_t *)malloc(0x10);
    uVar15 = 0x10;
    if (0xe < uVar8 - 1) {
      uVar15 = uVar8;
    }
    local_48->nCap = uVar15;
    if (uVar15 == 0) {
      piVar9 = (int *)0x0;
    }
    else {
      piVar9 = (int *)malloc((long)(int)uVar15 << 2);
    }
    local_48->pArray = piVar9;
    local_48->nSize = uVar8;
    auVar6 = _DAT_00912220;
    uVar15 = uVar8;
    if (0 < (int)uVar8) {
      lVar18 = (ulong)uVar8 - 1;
      auVar23._8_4_ = (int)lVar18;
      auVar23._0_8_ = lVar18;
      auVar23._12_4_ = (int)((ulong)lVar18 >> 0x20);
      uVar16 = 0;
      auVar23 = auVar23 ^ _DAT_00912220;
      auVar26 = _DAT_00912210;
      do {
        auVar25 = auVar26 ^ auVar6;
        if ((bool)(~(auVar25._4_4_ == auVar23._4_4_ && auVar23._0_4_ < auVar25._0_4_ ||
                    auVar23._4_4_ < auVar25._4_4_) & 1)) {
          piVar9[uVar16] = (int)uVar16;
        }
        if ((auVar25._12_4_ != auVar23._12_4_ || auVar25._8_4_ <= auVar23._8_4_) &&
            auVar25._12_4_ <= auVar23._12_4_) {
          piVar9[uVar16 + 1] = (int)uVar16 + 1;
        }
        uVar16 = uVar16 + 2;
        lVar18 = auVar26._8_8_;
        auVar26._0_8_ = auVar26._0_8_ + 2;
        auVar26._8_8_ = lVar18 + 2;
      } while ((uVar8 + 1 & 0xfffffffe) != uVar16);
      uVar15 = pVVar3->nSize;
    }
    if ((int)uVar8 < (int)uVar19) {
      uVar8 = uVar19;
    }
    uVar16 = (ulong)uVar8;
    if (pVVar10->nSize < (int)uVar15) {
      uVar15 = pVVar10->nSize;
    }
    printf("Matched %d vars by order.",(ulong)uVar15);
    iVar7 = pNtk1->vCis->nSize;
    iVar17 = pNtk2->vCis->nSize;
    if (iVar17 - iVar7 != 0 && iVar7 <= iVar17) {
      printf(" The last %d vars of Netlist2 are unmatched vars.",(ulong)(uint)(iVar17 - iVar7));
      iVar7 = pNtk1->vCis->nSize;
      iVar17 = pNtk2->vCis->nSize;
    }
    if (iVar7 <= iVar17) goto LAB_002adb66;
    pcVar11 = " The last %d vars of Netlist1 are unmatched vars.";
  }
  else {
    if (uVar8 == 0) {
      piVar9 = (int *)0x0;
    }
    else {
      piVar9 = (int *)malloc((long)(int)uVar8 << 2);
    }
    vMap->pArray = piVar9;
    vMap->nSize = uVar19;
    auVar6 = _DAT_00912220;
    if (0 < (int)uVar19) {
      lVar18 = (ulong)uVar19 - 1;
      auVar21._8_4_ = (int)lVar18;
      auVar21._0_8_ = lVar18;
      auVar21._12_4_ = (int)((ulong)lVar18 >> 0x20);
      uVar16 = 0;
      auVar21 = auVar21 ^ _DAT_00912220;
      auVar24 = _DAT_00912210;
      do {
        auVar25 = auVar24 ^ auVar6;
        if ((bool)(~(auVar25._4_4_ == auVar21._4_4_ && auVar21._0_4_ < auVar25._0_4_ ||
                    auVar21._4_4_ < auVar25._4_4_) & 1)) {
          piVar9[uVar16] = (int)uVar16;
        }
        if ((auVar25._12_4_ != auVar21._12_4_ || auVar25._8_4_ <= auVar21._8_4_) &&
            auVar25._12_4_ <= auVar21._12_4_) {
          piVar9[uVar16 + 1] = (int)uVar16 + 1;
        }
        uVar16 = uVar16 + 2;
        lVar18 = auVar24._8_8_;
        auVar24._0_8_ = auVar24._0_8_ + 2;
        auVar24._8_8_ = lVar18 + 2;
      } while ((uVar19 + 1 & 0xfffffffe) != uVar16);
    }
    iVar7 = pNtk2->vCis->nSize;
    local_48 = (Vec_Int_t *)malloc(0x10);
    iVar17 = 0x10;
    if (0xe < iVar7 - 1U) {
      iVar17 = iVar7;
    }
    local_48->nSize = 0;
    local_48->nCap = iVar17;
    uVar16 = 0;
    if (iVar17 == 0) {
      piVar9 = (int *)0x0;
    }
    else {
      piVar9 = (int *)malloc((long)iVar17 << 2);
    }
    local_48->pArray = piVar9;
    iVar7 = pVVar10->nSize;
    if (0 < iVar7) {
      uVar16 = 0;
      do {
        *(int *)((long)pVVar10->pArray[uVar16] + 0x40) = (int)uVar16;
        uVar16 = uVar16 + 1;
        pVVar10 = pNtk1->vCis;
        iVar7 = pVVar10->nSize;
      } while ((long)uVar16 < (long)iVar7);
    }
    if ((int)uVar16 != iVar7) {
      __assert_fail("Index == Abc_NtkCiNum(pNtk1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDress3.c"
                    ,0x89,"Gia_Man_t *Abc_NtkAigToGiaTwo(Abc_Ntk_t *, Abc_Ntk_t *, int)");
    }
    pVVar10 = pNtk2->vCis;
    if (pVVar10->nSize < 1) {
      uVar19 = 0;
    }
    else {
      lVar18 = 0;
      uVar19 = 0;
      do {
        pObj = (Abc_Obj_t *)pVVar10->pArray[lVar18];
        pNVar1 = pNtk1->pManName;
        pcVar11 = Abc_ObjName(pObj);
        uVar8 = Nm_ManFindIdByName(pNVar1,pcVar11,2);
        if ((int)uVar8 < 0) {
          pNVar1 = pNtk1->pManName;
          pcVar11 = Abc_ObjName(pObj);
          uVar8 = Nm_ManFindIdByName(pNVar1,pcVar11,5);
          if (-1 < (int)uVar8) goto LAB_002ad8a1;
          Vec_IntPush(local_48,(int)uVar16);
          uVar16 = (ulong)((int)uVar16 + 1);
        }
        else {
LAB_002ad8a1:
          if (pNtk1->vObjs->nSize <= (int)uVar8) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pvVar2 = pNtk1->vObjs->pArray[uVar8];
          uVar8 = *(uint *)((long)pvVar2 + 0x14) & 0xf;
          if ((uVar8 != 2) && (uVar8 != 5)) {
            __assert_fail("Num < 0 || Abc_ObjIsCi(Abc_NtkObj(pNtk1, Num))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDress3.c"
                          ,0x8f,"Gia_Man_t *Abc_NtkAigToGiaTwo(Abc_Ntk_t *, Abc_Ntk_t *, int)");
          }
          Vec_IntPush(local_48,*(int *)((long)pvVar2 + 0x40));
          uVar19 = uVar19 + 1;
        }
        lVar18 = lVar18 + 1;
        pVVar10 = pNtk2->vCis;
      } while (lVar18 < pVVar10->nSize);
    }
    printf("Matched %d vars by name.",(ulong)uVar19);
    if (pNtk1->vCis->nSize != uVar19) {
      printf(" Netlist1 has %d unmatched vars.");
    }
    if (pNtk2->vCis->nSize == uVar19) goto LAB_002adb66;
    pcVar11 = " Netlist2 has %d unmatched vars.";
  }
  printf(pcVar11);
LAB_002adb66:
  putchar(10);
  p = Gia_ManStart(10000);
  pcVar11 = pNtk1->pName;
  if (pcVar11 == (char *)0x0) {
    pcVar13 = (char *)0x0;
  }
  else {
    sVar12 = strlen(pcVar11);
    pcVar13 = (char *)malloc(sVar12 + 1);
    strcpy(pcVar13,pcVar11);
  }
  p->pName = pcVar13;
  pcVar11 = pNtk1->pSpec;
  if (pcVar11 == (char *)0x0) {
    pcVar13 = (char *)0x0;
  }
  else {
    sVar12 = strlen(pcVar11);
    pcVar13 = (char *)malloc(sVar12 + 1);
    strcpy(pcVar13,pcVar11);
  }
  p->pSpec = pcVar13;
  if (0 < (int)uVar16) {
    do {
      pGVar14 = Gia_ManAppendObj(p);
      uVar4 = *(ulong *)pGVar14;
      *(ulong *)pGVar14 = uVar4 | 0x9fffffff;
      *(ulong *)pGVar14 =
           uVar4 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar5 = p->pObjs;
      if ((pGVar14 < pGVar5) || (pGVar5 + p->nObjs <= pGVar14)) {
LAB_002add7b:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1d4,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar14 - (long)pGVar5) >> 2) * -0x55555555);
      if ((pGVar14 < p->pObjs) || (p->pObjs + p->nObjs <= pGVar14)) goto LAB_002add7b;
      uVar19 = (int)uVar16 - 1;
      uVar16 = (ulong)uVar19;
    } while (uVar19 != 0);
  }
  Gia_ManHashAlloc(p);
  Abc_NtkAigToGiaOne(p,pNtk1,vMap);
  Abc_NtkAigToGiaOne(p,pNtk2,local_48);
  Gia_ManHashStop(p);
  if (vMap->pArray != (int *)0x0) {
    free(vMap->pArray);
  }
  free(vMap);
  if (local_48->pArray != (int *)0x0) {
    free(local_48->pArray);
  }
  free(local_48);
  Gia_ManCreateValueRefs(p);
  iVar7 = p->nObjs;
  if (0 < iVar7) {
    iVar17 = 0;
    lVar18 = 4;
    lVar20 = 0;
    do {
      pGVar5 = p->pObjs;
      if (pGVar5 == (Gia_Obj_t *)0x0) {
        return p;
      }
      uVar19 = *(uint *)((long)pGVar5 + lVar18 * 2 + -8);
      if (((~uVar19 & 0x1fffffff) != 0 && -1 < (int)uVar19) &&
         (*(int *)(&pGVar5->field_0x0 + lVar18 * 2) == 0)) {
        Gia_ManAppendCo(p,iVar17);
        iVar7 = p->nObjs;
      }
      lVar20 = lVar20 + 1;
      iVar17 = iVar17 + 2;
      lVar18 = lVar18 + 6;
    } while (lVar20 < iVar7);
  }
  return p;
}

Assistant:

Gia_Man_t * Abc_NtkAigToGiaTwo( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int fByName )
{
    Gia_Man_t * p;
    Gia_Obj_t * pObj;
    Abc_Obj_t * pNode;
    Vec_Int_t * vMap1, * vMap2;
    int i, Index = 0;
    assert( Abc_NtkIsAigLogic(pNtk1) );
    assert( Abc_NtkIsAigLogic(pNtk2) );
    // find common variables
    if ( fByName )
    {
        int nCommon = 0;
        vMap1 = Vec_IntStartNatural( Abc_NtkCiNum(pNtk1) );
        vMap2 = Vec_IntAlloc( Abc_NtkCiNum(pNtk2) );
        Abc_NtkForEachCi( pNtk1, pNode, i )
            pNode->iTemp = Index++;
        assert( Index == Abc_NtkCiNum(pNtk1) );
        Abc_NtkForEachCi( pNtk2, pNode, i )
        {
            int Num = Nm_ManFindIdByName( pNtk1->pManName, Abc_ObjName(pNode), ABC_OBJ_PI );
            if ( Num < 0 )
                Num = Nm_ManFindIdByName( pNtk1->pManName, Abc_ObjName(pNode), ABC_OBJ_BO );
            assert( Num < 0 || Abc_ObjIsCi(Abc_NtkObj(pNtk1, Num)) );
            if ( Num >= 0 )
                Vec_IntPush( vMap2, Abc_NtkObj(pNtk1, Num)->iTemp ), nCommon++;
            else
                Vec_IntPush( vMap2, Index++ );
        }
        // report
        printf( "Matched %d vars by name.", nCommon );
        if ( nCommon != Abc_NtkCiNum(pNtk1) )
            printf( " Netlist1 has %d unmatched vars.", Abc_NtkCiNum(pNtk1) - nCommon );
        if ( nCommon != Abc_NtkCiNum(pNtk2) )
            printf( " Netlist2 has %d unmatched vars.", Abc_NtkCiNum(pNtk2) - nCommon );
        printf( "\n" );
    }
    else
    {
        vMap1 = Vec_IntStartNatural( Abc_NtkCiNum(pNtk1) );
        vMap2 = Vec_IntStartNatural( Abc_NtkCiNum(pNtk2) );
        Index = Abc_MaxInt( Vec_IntSize(vMap1), Vec_IntSize(vMap2) );
        // report
        printf( "Matched %d vars by order.", Abc_MinInt(Abc_NtkCiNum(pNtk1), Abc_NtkCiNum(pNtk2)) );
        if ( Abc_NtkCiNum(pNtk1) < Abc_NtkCiNum(pNtk2) )
            printf( " The last %d vars of Netlist2 are unmatched vars.", Abc_NtkCiNum(pNtk2) - Abc_NtkCiNum(pNtk1) );
        if ( Abc_NtkCiNum(pNtk1) > Abc_NtkCiNum(pNtk2) )
            printf( " The last %d vars of Netlist1 are unmatched vars.", Abc_NtkCiNum(pNtk1) - Abc_NtkCiNum(pNtk2) );
        printf( "\n" );
    }
    // create new manager
    p = Gia_ManStart( 10000 );
    p->pName = Abc_UtilStrsav( Abc_NtkName(pNtk1) );
    p->pSpec = Abc_UtilStrsav( Abc_NtkSpec(pNtk1) );
    for ( i = 0; i < Index; i++ )
        Gia_ManAppendCi(p);
    // add logic
    Gia_ManHashAlloc( p );
    Abc_NtkAigToGiaOne( p, pNtk1, vMap1 );
    Abc_NtkAigToGiaOne( p, pNtk2, vMap2 );
    Gia_ManHashStop( p );
    Vec_IntFree( vMap1 );
    Vec_IntFree( vMap2 );
    // add extra POs to dangling nodes
    Gia_ManCreateValueRefs( p );
    Gia_ManForEachAnd( p, pObj, i )
        if ( pObj->Value == 0 )
            Gia_ManAppendCo( p, Abc_Var2Lit(i, 0) );
    return p;
}